

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QList<unsigned_long_long> * __thiscall
QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::keys
          (QList<unsigned_long_long> *__return_storage_ptr__,
          QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this)

{
  key_iterator i1;
  key_iterator i2;
  long in_FS_OFFSET;
  const_iterator local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  begin(&local_30,this);
  i1.i.i.bucket = local_30.i.bucket;
  i1.i.i.d = local_30.i.d;
  i1.i.e = local_30.e;
  i2.i.e = (Chain **)0x0;
  i2.i.i.d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *
             )0x0;
  i2.i.i.bucket = 0;
  QList<unsigned_long_long>::
  QList<QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::key_iterator,_true>
            (__return_storage_ptr__,i1,i2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }